

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

Optional<unsigned_char> llvm::dwarf::getFixedFormByteSize(Form Form,FormParams Params)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  undefined6 in_register_0000003a;
  FormParams local_c [2];
  FormParams Params_local;
  
  uVar4 = 0;
  iVar1 = (int)CONCAT62(in_register_0000003a,Form);
  local_c[0].AddrSize = Params.AddrSize;
  local_c[0].Version = Params.Version;
  uVar3 = 0;
  local_c[0] = Params;
  switch(iVar1) {
  case 1:
    uVar3 = (ushort)local_c[0].AddrSize;
    if (local_c[0].Version == 0) {
      uVar3 = 0;
    }
    uVar4 = (ushort)(local_c[0].Version != 0 && local_c[0].AddrSize != 0) << 8;
    break;
  case 2:
  case 3:
  case 4:
  case 8:
  case 9:
  case 10:
  case 0xd:
  case 0xf:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x22:
  case 0x23:
  case 0x2b:
    break;
  case 5:
  case 0x12:
  case 0x26:
  case 0x2a:
    uVar4 = 0x100;
    uVar3 = 2;
    break;
  case 6:
  case 0x13:
  case 0x1c:
  case 0x28:
  case 0x2c:
    uVar4 = 0x100;
    uVar3 = 4;
    break;
  case 7:
  case 0x14:
  case 0x20:
  case 0x24:
    goto LAB_00d58b95;
  case 0xb:
  case 0xc:
  case 0x11:
  case 0x25:
  case 0x29:
    uVar4 = 0x100;
    uVar3 = 1;
    break;
  case 0x10:
    uVar4 = 0;
    uVar3 = 0;
    if ((local_c[0].Version != 0) && (local_c[0].AddrSize != 0)) {
      bVar2 = FormParams::getRefAddrByteSize(local_c);
      uVar3 = (ushort)bVar2;
      uVar4 = 0x100;
    }
    break;
  case 0x19:
  case 0x21:
    uVar4 = 0x100;
    uVar3 = 0;
    break;
  case 0x1e:
    uVar4 = 0x100;
    uVar3 = 0x10;
    break;
  case 0x27:
    uVar4 = 0x100;
    uVar3 = 3;
    break;
  default:
    uVar3 = 0;
    if (1 < iVar1 - 0x1f20U) break;
  case 0xe:
  case 0x17:
  case 0x1d:
  case 0x1f:
    uVar4 = 0;
    uVar3 = 0;
    if ((local_c[0].Version != 0) && (local_c[0].AddrSize != 0)) {
      local_c[0].Format = Params.Format;
      uVar4 = 0x100;
      uVar3 = 4;
      if (local_c[0].Format != DWARF32) {
        if (local_c[0].Format != DWARF64) {
          llvm_unreachable_internal
                    ("Invalid Format value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                     ,0x230);
        }
LAB_00d58b95:
        uVar4 = 0x100;
        uVar3 = 8;
      }
    }
  }
  return (OptionalStorage<unsigned_char,_true>)(uVar4 | uVar3);
}

Assistant:

Optional<uint8_t> llvm::dwarf::getFixedFormByteSize(dwarf::Form Form,
                                                    FormParams Params) {
  switch (Form) {
  case DW_FORM_addr:
    if (Params)
      return Params.AddrSize;
    return None;

  case DW_FORM_block:          // ULEB128 length L followed by L bytes.
  case DW_FORM_block1:         // 1 byte length L followed by L bytes.
  case DW_FORM_block2:         // 2 byte length L followed by L bytes.
  case DW_FORM_block4:         // 4 byte length L followed by L bytes.
  case DW_FORM_string:         // C-string with null terminator.
  case DW_FORM_sdata:          // SLEB128.
  case DW_FORM_udata:          // ULEB128.
  case DW_FORM_ref_udata:      // ULEB128.
  case DW_FORM_indirect:       // ULEB128.
  case DW_FORM_exprloc:        // ULEB128 length L followed by L bytes.
  case DW_FORM_strx:           // ULEB128.
  case DW_FORM_addrx:          // ULEB128.
  case DW_FORM_loclistx:       // ULEB128.
  case DW_FORM_rnglistx:       // ULEB128.
  case DW_FORM_GNU_addr_index: // ULEB128.
  case DW_FORM_GNU_str_index:  // ULEB128.
    return None;

  case DW_FORM_ref_addr:
    if (Params)
      return Params.getRefAddrByteSize();
    return None;

  case DW_FORM_flag:
  case DW_FORM_data1:
  case DW_FORM_ref1:
  case DW_FORM_strx1:
  case DW_FORM_addrx1:
    return 1;

  case DW_FORM_data2:
  case DW_FORM_ref2:
  case DW_FORM_strx2:
  case DW_FORM_addrx2:
    return 2;

  case DW_FORM_strx3:
    return 3;

  case DW_FORM_data4:
  case DW_FORM_ref4:
  case DW_FORM_ref_sup4:
  case DW_FORM_strx4:
  case DW_FORM_addrx4:
    return 4;

  case DW_FORM_strp:
  case DW_FORM_GNU_ref_alt:
  case DW_FORM_GNU_strp_alt:
  case DW_FORM_line_strp:
  case DW_FORM_sec_offset:
  case DW_FORM_strp_sup:
    if (Params)
      return Params.getDwarfOffsetByteSize();
    return None;

  case DW_FORM_data8:
  case DW_FORM_ref8:
  case DW_FORM_ref_sig8:
  case DW_FORM_ref_sup8:
    return 8;

  case DW_FORM_flag_present:
    return 0;

  case DW_FORM_data16:
    return 16;

  case DW_FORM_implicit_const:
    // The implicit value is stored in the abbreviation as a SLEB128, and
    // there no data in debug info.
    return 0;

  default:
    break;
  }
  return None;
}